

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlSInteger.cpp
# Opt level: O1

filepos_t __thiscall
libebml::EbmlSInteger::ReadData(EbmlSInteger *this,IOCallback *input,ScopeMode ReadFully)

{
  _func_int **pp_Var1;
  byte in_AL;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  binary Buffer [8];
  byte local_28 [8];
  
  if (ReadFully != SCOPE_NO_DATA) {
    local_28[0] = in_AL;
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    IOCallback::readFully(input,local_28,CONCAT44(extraout_var,iVar2));
    this->Value = (long)((char)local_28[0] >> 7);
    iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
    if (CONCAT44(extraout_var_00,iVar2) != 0) {
      uVar4 = 1;
      uVar5 = 0;
      do {
        pp_Var1 = (this->super_EbmlElement)._vptr_EbmlElement;
        uVar3 = this->Value << 8;
        this->Value = uVar3;
        this->Value = local_28[uVar5] | uVar3;
        uVar5 = (ulong)uVar4;
        iVar2 = (*pp_Var1[9])(this);
        uVar4 = uVar4 + 1;
      } while (uVar5 < CONCAT44(extraout_var_01,iVar2));
    }
    (this->super_EbmlElement).bValueIsSet = true;
  }
  iVar2 = (*(this->super_EbmlElement)._vptr_EbmlElement[9])(this);
  return CONCAT44(extraout_var_02,iVar2);
}

Assistant:

filepos_t EbmlSInteger::ReadData(IOCallback & input, ScopeMode ReadFully)
{
  if (ReadFully != SCOPE_NO_DATA) {
    binary Buffer[8];
    input.readFully(Buffer, GetSize());

    if (Buffer[0] & 0x80)
      Value = -1; // this is a negative value
    else
      Value = 0; // this is a positive value

    for (unsigned int i=0; i<GetSize(); i++) {
      Value <<= 8;
      Value |= Buffer[i];
    }
    SetValueIsSet();
  }

  return GetSize();
}